

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall
spv::Function::dump(Function *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  Block *root;
  int iVar1;
  bool bVar2;
  pointer this_00;
  size_type sVar3;
  const_reference ppIVar4;
  const_reference ppBVar5;
  undefined1 local_a8 [8];
  Instruction end;
  function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)> local_40;
  int local_1c;
  Block *pBStack_18;
  int p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Function *this_local;
  
  pBStack_18 = (Block *)out;
  out_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  bVar2 = std::operator!=(&this->lineInstruction,(nullptr_t)0x0);
  if (bVar2) {
    this_00 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                        (&this->lineInstruction);
    spv::Instruction::dump
              (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBStack_18);
  }
  spv::Instruction::dump
            (&this->functionInstruction,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBStack_18);
  for (local_1c = 0; iVar1 = local_1c,
      sVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size
                        (&this->parameterInstructions), iVar1 < (int)sVar3; local_1c = local_1c + 1)
  {
    ppIVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (&this->parameterInstructions,(long)local_1c);
    spv::Instruction::dump
              (*ppIVar4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBStack_18);
  }
  ppBVar5 = std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::operator[](&this->blocks,0);
  root = *ppBVar5;
  end.block = pBStack_18;
  std::function<void(spv::Block*,spv::ReachReason,spv::Block*)>::
  function<spv::Function::dump(std::vector<unsigned_int,std::allocator<unsigned_int>>&)const::_lambda(spv::Block_const*,spv::ReachReason,spv::Block*)_1_,void>
            ((function<void(spv::Block*,spv::ReachReason,spv::Block*)> *)&local_40,
             (anon_class_8_1_ba1d6aae *)&end.block);
  inReadableOrder(root,&local_40);
  std::function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)>::~function(&local_40);
  spv::Instruction::Instruction((Instruction *)local_a8,0,0,OpFunctionEnd);
  spv::Instruction::dump
            ((Instruction *)local_a8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBStack_18);
  spv::Instruction::~Instruction((Instruction *)local_a8);
  return;
}

Assistant:

void dump(std::vector<unsigned int>& out) const
    {
        // OpLine
        if (lineInstruction != nullptr) {
            lineInstruction->dump(out);
        }

        // OpFunction
        functionInstruction.dump(out);

        // OpFunctionParameter
        for (int p = 0; p < (int)parameterInstructions.size(); ++p)
            parameterInstructions[p]->dump(out);

        // Blocks
        inReadableOrder(blocks[0], [&out](const Block* b, ReachReason, Block*) { b->dump(out); });
        Instruction end(0, 0, OpFunctionEnd);
        end.dump(out);
    }